

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

ssize_t archive_write_pax_data(archive_write *a,void *buff,size_t s)

{
  long *plVar1;
  void *pvVar2;
  ulong uVar3;
  undefined8 *puVar4;
  int iVar5;
  undefined8 *__ptr;
  ulong uVar6;
  ulong length;
  
  pvVar2 = a->format_data;
  if (*(size_t *)((long)pvVar2 + 0x48) != 0) {
    iVar5 = __archive_write_output
                      (a,*(void **)((long)pvVar2 + 0x40),*(size_t *)((long)pvVar2 + 0x48));
    if ((iVar5 != 0) ||
       (iVar5 = __archive_write_nulls(a,*(size_t *)((long)pvVar2 + 0x58)), iVar5 != 0)) {
LAB_003f7b9d:
      return (long)iVar5;
    }
    *(undefined8 *)((long)pvVar2 + 0x48) = 0;
  }
  uVar6 = 0;
  do {
    length = s - uVar6;
    if (s < uVar6 || length == 0) {
      return uVar6;
    }
    __ptr = *(undefined8 **)((long)pvVar2 + 0x60);
    while( true ) {
      if (__ptr == (undefined8 *)0x0) {
        return uVar6;
      }
      uVar3 = __ptr[3];
      if (uVar3 != 0) break;
      puVar4 = (undefined8 *)*__ptr;
      free(__ptr);
      *(undefined8 **)((long)pvVar2 + 0x60) = puVar4;
      __ptr = puVar4;
    }
    if (uVar3 <= length) {
      length = uVar3;
    }
    if (*(int *)(__ptr + 1) == 0) {
      iVar5 = __archive_write_output(a,(void *)((long)buff + uVar6),length);
      plVar1 = (long *)(*(long *)((long)pvVar2 + 0x60) + 0x18);
      *plVar1 = *plVar1 - length;
      if (iVar5 != 0) goto LAB_003f7b9d;
    }
    else {
      __ptr[3] = uVar3 - length;
    }
    uVar6 = uVar6 + length;
  } while( true );
}

Assistant:

static ssize_t
archive_write_pax_data(struct archive_write *a, const void *buff, size_t s)
{
	struct pax *pax;
	size_t ws;
	size_t total;
	int ret;

	pax = (struct pax *)a->format_data;

	/*
	 * According to GNU PAX format 1.0, write a sparse map
	 * before the body.
	 */
	if (archive_strlen(&(pax->sparse_map))) {
		ret = __archive_write_output(a, pax->sparse_map.s,
		    archive_strlen(&(pax->sparse_map)));
		if (ret != ARCHIVE_OK)
			return (ret);
		ret = __archive_write_nulls(a, pax->sparse_map_padding);
		if (ret != ARCHIVE_OK)
			return (ret);
		archive_string_empty(&(pax->sparse_map));
	}

	total = 0;
	while (total < s) {
		const unsigned char *p;

		while (pax->sparse_list != NULL &&
		    pax->sparse_list->remaining == 0) {
			struct sparse_block *sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}

		if (pax->sparse_list == NULL)
			return (total);

		p = ((const unsigned char *)buff) + total;
		ws = s - total;
		if (ws > pax->sparse_list->remaining)
			ws = (size_t)pax->sparse_list->remaining;

		if (pax->sparse_list->is_hole) {
			/* Current block is hole thus we do not write
			 * the body. */
			pax->sparse_list->remaining -= ws;
			total += ws;
			continue;
		}

		ret = __archive_write_output(a, p, ws);
		pax->sparse_list->remaining -= ws;
		total += ws;
		if (ret != ARCHIVE_OK)
			return (ret);
	}
	return (total);
}